

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O2

void get_msurf_descriptor_precompute_gauss_case(integral_image *iimage,interest_point *ipoint)

{
  undefined4 uVar1;
  int i_1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int scale;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int i;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  uint uVar37;
  float fVar38;
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar43 [16];
  undefined1 auVar47 [64];
  float fVar48;
  float local_10c;
  uint local_ac;
  uint local_a8;
  int local_a4;
  float ry;
  float rx;
  ulong local_98;
  float local_8c;
  uint local_88;
  float local_84;
  interest_point *local_80;
  undefined1 local_78 [16];
  long local_68;
  ulong local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar40._8_4_ = 0x3effffff;
  auVar40._0_8_ = 0x3effffff3effffff;
  auVar40._12_4_ = 0x3effffff;
  auVar21._8_4_ = 0x80000000;
  auVar21._0_8_ = 0x8000000080000000;
  auVar21._12_4_ = 0x80000000;
  fVar28 = ipoint->scale;
  local_58 = ZEXT416((uint)fVar28);
  auVar10 = vpternlogd_avx512vl(auVar40,local_58,auVar21,0xf8);
  auVar10 = ZEXT416((uint)(fVar28 + auVar10._0_4_));
  auVar10 = vroundss_avx(auVar10,auVar10,0xb);
  scale = (int)auVar10._0_4_;
  fVar48 = -0.08 / (fVar28 * fVar28);
  auVar10 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)ipoint->x),auVar21,0xf8);
  auVar13._0_8_ = (double)fVar28;
  auVar13._8_8_ = 0;
  auVar10 = ZEXT416((uint)(ipoint->x + auVar10._0_4_));
  auVar10 = vroundss_avx(auVar10,auVar10,0xb);
  auVar11._0_8_ = (double)auVar10._0_4_;
  auVar11._8_8_ = auVar10._8_8_;
  auVar10 = vfmadd231sd_fma(auVar11,auVar13,ZEXT816(0x3fe0000000000000));
  local_84 = (float)auVar10._0_8_;
  auVar10 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)ipoint->y),auVar21,0xf8);
  auVar10 = ZEXT416((uint)(ipoint->y + auVar10._0_4_));
  auVar10 = vroundss_avx(auVar10,auVar10,0xb);
  auVar12._0_8_ = (double)auVar10._0_4_;
  auVar12._8_8_ = auVar10._8_8_;
  auVar10 = vfmadd231sd_fma(auVar12,auVar13,ZEXT816(0x3fe0000000000000));
  local_8c = (float)auVar10._0_8_;
  auVar10 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)(fVar28 * 0.5)),auVar21,0xf8);
  auVar10 = ZEXT416((uint)(fVar28 * 0.5 + auVar10._0_4_));
  auVar10 = vroundss_avx(auVar10,auVar10,0xb);
  auVar11 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)(fVar28 * 1.5)),auVar21,0xf8);
  auVar11 = ZEXT416((uint)(fVar28 * 1.5 + auVar11._0_4_));
  auVar11 = vroundss_avx(auVar11,auVar11,0xb);
  auVar12 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)(fVar28 * 2.5)),auVar21,0xf8);
  auVar12 = ZEXT416((uint)(fVar28 * 2.5 + auVar12._0_4_));
  auVar12 = vroundss_avx(auVar12,auVar12,0xb);
  auVar13 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)(fVar28 * 3.5)),auVar21,0xf8);
  auVar13 = ZEXT416((uint)(fVar28 * 3.5 + auVar13._0_4_));
  auVar13 = vroundss_avx(auVar13,auVar13,0xb);
  auVar14 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)(fVar28 * 4.5)),auVar21,0xf8);
  auVar14 = ZEXT416((uint)(fVar28 * 4.5 + auVar14._0_4_));
  auVar14 = vroundss_avx(auVar14,auVar14,0xb);
  auVar15 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)(fVar28 * 5.5)),auVar21,0xf8);
  auVar15 = ZEXT416((uint)(auVar15._0_4_ + fVar28 * 5.5));
  auVar15 = vroundss_avx(auVar15,auVar15,0xb);
  auVar16 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)(fVar28 * 6.5)),auVar21,0xf8);
  auVar16 = ZEXT416((uint)(fVar28 * 6.5 + auVar16._0_4_));
  auVar16 = vroundss_avx(auVar16,auVar16,0xb);
  auVar17 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)(fVar28 * 7.5)),auVar21,0xf8);
  auVar17 = ZEXT416((uint)(fVar28 * 7.5 + auVar17._0_4_));
  auVar17 = vroundss_avx(auVar17,auVar17,0xb);
  auVar18 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)(fVar28 * 8.5)),auVar21,0xf8);
  auVar18 = ZEXT416((uint)(fVar28 * 8.5 + auVar18._0_4_));
  auVar18 = vroundss_avx(auVar18,auVar18,0xb);
  auVar19 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)(fVar28 * 9.5)),auVar21,0xf8);
  auVar19 = ZEXT416((uint)(fVar28 * 9.5 + auVar19._0_4_));
  auVar19 = vroundss_avx(auVar19,auVar19,0xb);
  auVar20 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)(fVar28 * 10.5)),auVar21,0xf8);
  auVar20 = ZEXT416((uint)(fVar28 * 10.5 + auVar20._0_4_));
  auVar20 = vroundss_avx(auVar20,auVar20,0xb);
  auVar21 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)(fVar28 * 11.5)),auVar21,0xf8);
  fVar29 = auVar12._0_4_;
  fVar23 = fVar29 + auVar10._0_4_;
  fVar22 = fVar29 + auVar11._0_4_;
  fVar24 = fVar29 - auVar10._0_4_;
  fVar25 = fVar29 - auVar11._0_4_;
  fVar26 = fVar29 - auVar13._0_4_;
  auVar10 = ZEXT416((uint)(fVar28 * 11.5 + auVar21._0_4_));
  auVar10 = vroundss_avx(auVar10,auVar10,0xb);
  fVar28 = fVar29 - auVar15._0_4_;
  fVar27 = fVar29 - auVar14._0_4_;
  fVar36 = auVar17._0_4_;
  fVar30 = fVar36 - auVar13._0_4_;
  fVar29 = fVar29 - auVar16._0_4_;
  fVar31 = fVar36 - auVar14._0_4_;
  local_78._0_4_ = fVar36 - auVar10._0_4_;
  fVar32 = fVar36 - auVar15._0_4_;
  fVar34 = fVar36 - auVar18._0_4_;
  local_98 = CONCAT44(local_98._4_4_,fVar36 - auVar16._0_4_);
  fVar35 = fVar36 - auVar19._0_4_;
  auVar47 = ZEXT464((uint)fVar35);
  fVar36 = fVar36 - auVar20._0_4_;
  local_80 = ipoint;
  fVar22 = expf(fVar48 * fVar22 * fVar22);
  fVar23 = expf(fVar23 * fVar23 * fVar48);
  fVar24 = expf(fVar24 * fVar24 * fVar48);
  fVar25 = expf(fVar25 * fVar25 * fVar48);
  fVar26 = expf(fVar26 * fVar26 * fVar48);
  fVar27 = expf(fVar27 * fVar27 * fVar48);
  fVar28 = expf(fVar28 * fVar28 * fVar48);
  fVar29 = expf(fVar29 * fVar29 * fVar48);
  fVar30 = expf(fVar30 * fVar30 * fVar48);
  fVar31 = expf(fVar31 * fVar31 * fVar48);
  fVar32 = expf(fVar32 * fVar32 * fVar48);
  fVar33 = expf((float)local_98 * (float)local_98 * fVar48);
  fVar34 = expf(fVar34 * fVar34 * fVar48);
  fVar35 = expf(fVar35 * fVar35 * fVar48);
  fVar36 = expf(fVar36 * fVar36 * fVar48);
  fVar48 = expf((float)local_78._0_4_ * (float)local_78._0_4_ * fVar48);
  auVar39 = ZEXT1264(ZEXT812(0));
  iVar9 = -8;
  local_a8 = 4;
  iVar4 = 0;
  lVar2 = 0;
  local_ac = 0;
  do {
    if (7 < iVar9) {
      if (auVar39._0_4_ < 0.0) {
        fVar28 = sqrtf(auVar39._0_4_);
      }
      else {
        auVar10 = vsqrtss_avx(auVar39._0_16_,auVar39._0_16_);
        fVar28 = auVar10._0_4_;
      }
      for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
        local_80->descriptor[lVar2] = (1.0 / fVar28) * local_80->descriptor[lVar2];
      }
      return;
    }
    lVar2 = (long)(int)lVar2;
    local_a4 = -3;
    uVar3 = 0xfffffff8;
    uVar5 = local_ac;
    while (uVar5 != local_a8) {
      fVar45 = 0.0;
      fVar46 = 0.0;
      fVar42 = 0.0;
      fVar44 = 0.0;
      uVar7 = 0xfffffffc;
      uVar37 = auVar39._0_4_;
      local_88 = uVar5;
      local_68 = lVar2;
      local_60 = uVar3;
      for (iVar6 = (int)uVar3 + -4; iVar8 = (int)local_60, iVar6 != local_a4; iVar6 = iVar6 + 1) {
        uVar1 = (undefined4)uVar7;
        if (iVar8 == 7) {
          local_10c = -1.0;
          switch(uVar1) {
          case 0:
switchD_0015841e_caseD_0:
            local_10c = 1.0;
            break;
          case 1:
switchD_0015841e_caseD_ffffffff:
            local_10c = fVar34;
            break;
          case 2:
switchD_0015841e_caseD_fffffffe:
            local_10c = fVar35;
            break;
          case 3:
switchD_0015841e_caseD_fffffffd:
            local_10c = fVar36;
            break;
          case 4:
switchD_0015841e_caseD_fffffffc:
            local_10c = fVar48;
            break;
          case 0xfffffffc:
switchD_0015841e_caseD_4:
            local_10c = fVar30;
            break;
          case 0xfffffffd:
switchD_0015841e_caseD_3:
            local_10c = fVar31;
            break;
          case 0xfffffffe:
switchD_0015841e_caseD_2:
            local_10c = fVar32;
            break;
          case 0xffffffff:
switchD_0015841e_caseD_1:
            local_10c = fVar33;
          }
        }
        else if (iVar8 == -3) {
          local_10c = -1.0;
          switch(uVar1) {
          case 0:
            goto switchD_0015841e_caseD_0;
          case 1:
switchD_00158474_caseD_ffffffff:
            local_10c = fVar25;
            break;
          case 2:
switchD_00158474_caseD_fffffffe:
            local_10c = fVar24;
            break;
          case 3:
switchD_00158474_caseD_fffffffd:
            local_10c = fVar23;
            break;
          case 4:
switchD_00158474_caseD_fffffffc:
            local_10c = fVar22;
            break;
          case 0xfffffffc:
switchD_00158474_caseD_4:
            local_10c = fVar29;
            break;
          case 0xfffffffd:
switchD_00158474_caseD_3:
            local_10c = fVar28;
            break;
          case 0xfffffffe:
switchD_00158474_caseD_2:
            local_10c = fVar27;
            break;
          case 0xffffffff:
switchD_00158474_caseD_1:
            local_10c = fVar26;
          }
        }
        else if (iVar8 == 2) {
          local_10c = -1.0;
          switch(uVar1) {
          case 0:
            goto switchD_0015841e_caseD_0;
          case 1:
            goto switchD_00158474_caseD_1;
          case 2:
            goto switchD_00158474_caseD_2;
          case 3:
            goto switchD_00158474_caseD_3;
          case 4:
            goto switchD_00158474_caseD_4;
          case 0xfffffffc:
            goto switchD_00158474_caseD_fffffffc;
          case 0xfffffffd:
            goto switchD_00158474_caseD_fffffffd;
          case 0xfffffffe:
            goto switchD_00158474_caseD_fffffffe;
          case 0xffffffff:
            goto switchD_00158474_caseD_ffffffff;
          }
        }
        else {
          local_10c = -1.0;
          if (iVar8 == -8) {
            local_10c = -1.0;
            switch(uVar1) {
            case 0:
              goto switchD_0015841e_caseD_0;
            case 1:
              goto switchD_0015841e_caseD_1;
            case 2:
              goto switchD_0015841e_caseD_2;
            case 3:
              goto switchD_0015841e_caseD_3;
            case 4:
              goto switchD_0015841e_caseD_4;
            case 0xfffffffc:
              goto switchD_0015841e_caseD_fffffffc;
            case 0xfffffffd:
              goto switchD_0015841e_caseD_fffffffd;
            case 0xfffffffe:
              goto switchD_0015841e_caseD_fffffffe;
            case 0xffffffff:
              goto switchD_0015841e_caseD_ffffffff;
            }
          }
        }
        auVar10._0_4_ = (float)iVar6;
        auVar10._4_12_ = auVar47._4_12_;
        auVar10 = vfmadd132ss_fma(auVar10,ZEXT416((uint)local_8c),ZEXT416((uint)local_58._0_4_));
        auVar15._8_4_ = 0x3effffff;
        auVar15._0_8_ = 0x3effffff3effffff;
        auVar15._12_4_ = 0x3effffff;
        auVar14._8_4_ = 0x80000000;
        auVar14._0_8_ = 0x8000000080000000;
        auVar14._12_4_ = 0x80000000;
        auVar11 = vpternlogd_avx512vl(auVar15,auVar10,auVar14,0xf8);
        auVar10 = ZEXT416((uint)(auVar10._0_4_ + auVar11._0_4_));
        auVar10 = vroundss_avx(auVar10,auVar10,0xb);
        iVar8 = -0xc;
        local_98 = uVar7;
        while (iVar8 != -3) {
          if (iVar9 == 7) {
            fVar38 = -1.0;
            switch(iVar8) {
            case -0xc:
switchD_001585df_caseD_fffffffc:
              fVar38 = fVar30;
              break;
            case -0xb:
switchD_001585df_caseD_fffffffb:
              fVar38 = fVar31;
              break;
            case -10:
switchD_001585df_caseD_fffffffa:
              fVar38 = fVar32;
              break;
            case -9:
switchD_001585df_caseD_fffffff9:
              fVar38 = fVar33;
              break;
            case -8:
switchD_001585df_caseD_fffffff8:
              fVar38 = 1.0;
              break;
            case -7:
switchD_001585df_caseD_fffffff7:
              fVar38 = fVar34;
              break;
            case -6:
switchD_001585df_caseD_fffffff6:
              fVar38 = fVar35;
              break;
            case -5:
switchD_001585df_caseD_fffffff5:
              fVar38 = fVar36;
              break;
            case -4:
switchD_001585df_caseD_fffffff4:
              fVar38 = fVar48;
            }
          }
          else if (iVar9 == -3) {
            fVar38 = -1.0;
            switch(iVar8) {
            case -0xc:
switchD_00158627_caseD_fffffffc:
              fVar38 = fVar29;
              break;
            case -0xb:
switchD_00158627_caseD_fffffffb:
              fVar38 = fVar28;
              break;
            case -10:
switchD_00158627_caseD_fffffffa:
              fVar38 = fVar27;
              break;
            case -9:
switchD_00158627_caseD_fffffff9:
              fVar38 = fVar26;
              break;
            case -8:
              goto switchD_001585df_caseD_fffffff8;
            case -7:
switchD_00158627_caseD_fffffff7:
              fVar38 = fVar25;
              break;
            case -6:
switchD_00158627_caseD_fffffff6:
              fVar38 = fVar24;
              break;
            case -5:
switchD_00158627_caseD_fffffff5:
              fVar38 = fVar23;
              break;
            case -4:
switchD_00158627_caseD_fffffff4:
              fVar38 = fVar22;
            }
          }
          else if (iVar9 == 2) {
            fVar38 = -1.0;
            switch(iVar8) {
            case -0xc:
              goto switchD_00158627_caseD_fffffff4;
            case -0xb:
              goto switchD_00158627_caseD_fffffff5;
            case -10:
              goto switchD_00158627_caseD_fffffff6;
            case -9:
              goto switchD_00158627_caseD_fffffff7;
            case -8:
              goto switchD_001585df_caseD_fffffff8;
            case -7:
              goto switchD_00158627_caseD_fffffff9;
            case -6:
              goto switchD_00158627_caseD_fffffffa;
            case -5:
              goto switchD_00158627_caseD_fffffffb;
            case -4:
              goto switchD_00158627_caseD_fffffffc;
            }
          }
          else {
            fVar38 = -1.0;
            if (iVar9 == -8) {
              fVar38 = -1.0;
              switch(iVar8) {
              case -0xc:
                goto switchD_001585df_caseD_fffffff4;
              case -0xb:
                goto switchD_001585df_caseD_fffffff5;
              case -10:
                goto switchD_001585df_caseD_fffffff6;
              case -9:
                goto switchD_001585df_caseD_fffffff7;
              case -8:
                goto switchD_001585df_caseD_fffffff8;
              case -7:
                goto switchD_001585df_caseD_fffffff9;
              case -6:
                goto switchD_001585df_caseD_fffffffa;
              case -5:
                goto switchD_001585df_caseD_fffffffb;
              case -4:
                goto switchD_001585df_caseD_fffffffc;
              }
            }
          }
          rx = 0.0;
          ry = 0.0;
          auVar19._0_4_ = (float)(iVar4 + iVar8);
          auVar19._4_12_ = auVar47._4_12_;
          auVar11 = vfmadd132ss_fma(auVar19,ZEXT416((uint)local_84),ZEXT416((uint)local_58._0_4_));
          auVar20._8_4_ = 0x3effffff;
          auVar20._0_8_ = 0x3effffff3effffff;
          auVar20._12_4_ = 0x3effffff;
          auVar16._8_4_ = 0x80000000;
          auVar16._0_8_ = 0x8000000080000000;
          auVar16._12_4_ = 0x80000000;
          auVar12 = vpternlogd_avx512vl(auVar20,auVar11,auVar16,0xf8);
          auVar11 = ZEXT416((uint)(auVar11._0_4_ + auVar12._0_4_));
          auVar11 = vroundss_avx(auVar11,auVar11,0xb);
          local_78 = ZEXT416((uint)(fVar38 * local_10c));
          haarXY_precheck_boundaries
                    (iimage,(int)auVar10._0_4_ - scale,(int)auVar11._0_4_ - scale,scale,&rx,&ry);
          iVar8 = iVar8 + 1;
          auVar11 = vinsertps_avx(ZEXT416((uint)ry),ZEXT416((uint)rx),0x10);
          auVar18._0_4_ = (float)local_78._0_4_ * auVar11._0_4_;
          auVar18._4_4_ = (float)local_78._0_4_ * auVar11._4_4_;
          auVar18._8_4_ = (float)local_78._0_4_ * auVar11._8_4_;
          auVar18._12_4_ = (float)local_78._0_4_ * auVar11._12_4_;
          auVar17._8_4_ = 0x7fffffff;
          auVar17._0_8_ = 0x7fffffff7fffffff;
          auVar17._12_4_ = 0x7fffffff;
          auVar11 = vandps_avx512vl(auVar18,auVar17);
          auVar11 = vmovlhps_avx(auVar18,auVar11);
          fVar42 = fVar42 + auVar11._0_4_;
          fVar44 = fVar44 + auVar11._4_4_;
          fVar45 = fVar45 + auVar11._8_4_;
          fVar46 = fVar46 + auVar11._12_4_;
          auVar39 = ZEXT464(uVar37);
        }
        uVar7 = (ulong)((int)local_98 + 1);
      }
      if (local_88 < 0x10) {
        local_48 = ZEXT416((uint)gauss_s2_arr[local_88]);
      }
      local_a4 = local_a4 + 5;
      uVar3 = (ulong)(iVar8 + 5);
      uVar5 = local_88 + 1;
      auVar43._0_4_ = fVar42 * (float)local_48._0_4_;
      auVar43._4_4_ = fVar44 * (float)local_48._0_4_;
      auVar43._8_4_ = fVar45 * (float)local_48._0_4_;
      auVar43._12_4_ = fVar46 * (float)local_48._0_4_;
      auVar41._0_4_ = auVar43._0_4_ * auVar43._0_4_;
      auVar41._4_4_ = auVar43._4_4_ * auVar43._4_4_;
      auVar41._8_4_ = auVar43._8_4_ * auVar43._8_4_;
      auVar41._12_4_ = auVar43._12_4_ * auVar43._12_4_;
      auVar11 = vshufpd_avx(auVar43,auVar43,1);
      *(undefined1 (*) [16])(local_80->descriptor + local_68) = auVar43;
      lVar2 = local_68 + 4;
      auVar10 = vmovshdup_avx(auVar41);
      auVar10 = vfmadd231ss_fma(auVar10,auVar43,auVar43);
      auVar11 = vfmadd213ss_fma(auVar11,auVar11,auVar10);
      auVar10 = vshufps_avx(auVar43,auVar43,0xff);
      auVar10 = vfmadd213ss_fma(auVar10,auVar10,auVar11);
      auVar39 = ZEXT464((uint)(auVar39._0_4_ + auVar10._0_4_));
    }
    local_ac = local_ac + 4;
    local_a8 = local_a8 + 4;
    iVar9 = iVar9 + 5;
    iVar4 = iVar4 + 5;
  } while( true );
}

Assistant:

void get_msurf_descriptor_precompute_gauss_case(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_inlinedHaarWavelets
        - precompute gauss_s2 like get_msurf_descriptor_gauss_s2_precomputed 
          (changed to use case statements here)
        - precompute gauss_s1 by computing them once 
          with separable kernels and using case statements
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    float gauss_s1_c0_m4 = expf(g1_factor * (e_c0_m4 * e_c0_m4));
    float gauss_s1_c0_m3 = expf(g1_factor * (e_c0_m3 * e_c0_m3));
    float gauss_s1_c0_m2 = expf(g1_factor * (e_c0_m2 * e_c0_m2));
    float gauss_s1_c0_m1 = expf(g1_factor * (e_c0_m1 * e_c0_m1));
    float gauss_s1_c0_z0 = 1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    float gauss_s1_c0_p1 = expf(g1_factor * (e_c0_p1 * e_c0_p1));
    float gauss_s1_c0_p2 = expf(g1_factor * (e_c0_p2 * e_c0_p2));
    float gauss_s1_c0_p3 = expf(g1_factor * (e_c0_p3 * e_c0_p3));
    float gauss_s1_c0_p4 = expf(g1_factor * (e_c0_p4 * e_c0_p4));

    float gauss_s1_c1_m4 = expf(g1_factor * (e_c1_m4 * e_c1_m4));
    float gauss_s1_c1_m3 = expf(g1_factor * (e_c1_m3 * e_c1_m3));
    float gauss_s1_c1_m2 = expf(g1_factor * (e_c1_m2 * e_c1_m2));
    float gauss_s1_c1_m1 = expf(g1_factor * (e_c1_m1 * e_c1_m1));
    float gauss_s1_c1_z0 = 1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    float gauss_s1_c1_p1 = expf(g1_factor * (e_c1_p1 * e_c1_p1));
    float gauss_s1_c1_p2 = expf(g1_factor * (e_c1_p2 * e_c1_p2));
    float gauss_s1_c1_p3 = expf(g1_factor * (e_c1_p3 * e_c1_p3));
    float gauss_s1_c1_p4 = expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        for (int j=-8; j<8; j+=5) {

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            //int xs = (int) roundf(ipoint_x + (i+0.5f) * scale);
            //int ys = (int) roundf(ipoint_y + (j+0.5f) * scale);

            int gauss_index_l = -4;
            for (int l = j-4; l < j + 5; ++l, ++gauss_index_l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                //float ys_sub_sample_y = (float) ys-sample_y;
                //float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                //Get y coords of sample point
                int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = -1;
                if (j == -8) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c1_p4; break;
                        case -3: gauss_s1_y = gauss_s1_c1_p3; break;
                        case -2: gauss_s1_y = gauss_s1_c1_p2; break;
                        case -1: gauss_s1_y = gauss_s1_c1_p1; break;
                        case 0:  gauss_s1_y = gauss_s1_c1_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c1_m1; break;
                        case 2:  gauss_s1_y = gauss_s1_c1_m2; break;
                        case 3:  gauss_s1_y = gauss_s1_c1_m3; break;
                        case 4:  gauss_s1_y = gauss_s1_c1_m4; break;
                    };
                } else if (j == -3) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c0_p4; break;
                        case -3: gauss_s1_y = gauss_s1_c0_p3; break;
                        case -2: gauss_s1_y = gauss_s1_c0_p2; break;
                        case -1: gauss_s1_y = gauss_s1_c0_p1; break;
                        case 0:  gauss_s1_y = gauss_s1_c0_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c0_m1; break;
                        case 2:  gauss_s1_y = gauss_s1_c0_m2; break;
                        case 3:  gauss_s1_y = gauss_s1_c0_m3; break;
                        case 4:  gauss_s1_y = gauss_s1_c0_m4; break;
                    };
                } else if (j == 2) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c0_m4; break;
                        case -3: gauss_s1_y = gauss_s1_c0_m3; break;
                        case -2: gauss_s1_y = gauss_s1_c0_m2; break;
                        case -1: gauss_s1_y = gauss_s1_c0_m1; break;
                        case 0:  gauss_s1_y = gauss_s1_c0_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c0_p1; break;
                        case 2:  gauss_s1_y = gauss_s1_c0_p2; break;
                        case 3:  gauss_s1_y = gauss_s1_c0_p3; break;
                        case 4:  gauss_s1_y = gauss_s1_c0_p4; break;
                    };
                } else if (j == 7) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c1_m4; break;
                        case -3: gauss_s1_y = gauss_s1_c1_m3; break;
                        case -2: gauss_s1_y = gauss_s1_c1_m2; break;
                        case -1: gauss_s1_y = gauss_s1_c1_m1; break;
                        case 0:  gauss_s1_y = gauss_s1_c1_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c1_p1; break;
                        case 2:  gauss_s1_y = gauss_s1_c1_p2; break;
                        case 3:  gauss_s1_y = gauss_s1_c1_p3; break;
                        case 4:  gauss_s1_y = gauss_s1_c1_p4; break;
                    };
                }

                int gauss_index_k = -4;
                for (int k = i-4; k < i + 5; ++k, ++gauss_index_k) {
                
                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    //float xs_sub_sample_x = (float) xs-sample_x;
                    //float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;

                    //Get x coords of sample point
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    float gauss_s1_x = -1;
                    if (i == -8) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c1_p4; break;
                            case -3: gauss_s1_x = gauss_s1_c1_p3; break;
                            case -2: gauss_s1_x = gauss_s1_c1_p2; break;
                            case -1: gauss_s1_x = gauss_s1_c1_p1; break;
                            case 0:  gauss_s1_x = gauss_s1_c1_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c1_m1; break;
                            case 2:  gauss_s1_x = gauss_s1_c1_m2; break;
                            case 3:  gauss_s1_x = gauss_s1_c1_m3; break;
                            case 4:  gauss_s1_x = gauss_s1_c1_m4; break;
                        };
                    } else if (i == -3) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c0_p4; break;
                            case -3: gauss_s1_x = gauss_s1_c0_p3; break;
                            case -2: gauss_s1_x = gauss_s1_c0_p2; break;
                            case -1: gauss_s1_x = gauss_s1_c0_p1; break;
                            case 0:  gauss_s1_x = gauss_s1_c0_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c0_m1; break;
                            case 2:  gauss_s1_x = gauss_s1_c0_m2; break;
                            case 3:  gauss_s1_x = gauss_s1_c0_m3; break;
                            case 4:  gauss_s1_x = gauss_s1_c0_m4; break;
                        };
                    } else if (i == 2) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c0_m4; break;
                            case -3: gauss_s1_x = gauss_s1_c0_m3; break;
                            case -2: gauss_s1_x = gauss_s1_c0_m2; break;
                            case -1: gauss_s1_x = gauss_s1_c0_m1; break;
                            case 0:  gauss_s1_x = gauss_s1_c0_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c0_p1; break;
                            case 2:  gauss_s1_x = gauss_s1_c0_p2; break;
                            case 3:  gauss_s1_x = gauss_s1_c0_p3; break;
                            case 4:  gauss_s1_x = gauss_s1_c0_p4; break;
                        };
                    } else if (i == 7) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c1_m4; break;
                            case -3: gauss_s1_x = gauss_s1_c1_m3; break;
                            case -2: gauss_s1_x = gauss_s1_c1_m2; break;
                            case -1: gauss_s1_x = gauss_s1_c1_m1; break;
                            case 0:  gauss_s1_x = gauss_s1_c1_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c1_p1; break;
                            case 2:  gauss_s1_x = gauss_s1_c1_p2; break;
                            case 3:  gauss_s1_x = gauss_s1_c1_p3; break;
                            case 4:  gauss_s1_x = gauss_s1_c1_p4; break;
                        };
                    }

/*
                    //Get the gaussian weighted x and y responses
                    float gauss_s1_x_real = expf(g1_factor * (xs_sub_sample_x_squared));
                    float gauss_s1_y_real = expf(g1_factor * (ys_sub_sample_y_squared));

                    if (gauss_s1_x != gauss_s1_x_real || gauss_s1_y != gauss_s1_y_real) {
                        std::cout << "gauss_s1_x: " << gauss_s1_x << std::endl;
                        std::cout << "gauss_s1_y: " << gauss_s1_y << std::endl;
                        std::cout << "gauss_s1_x_real: " << gauss_s1_x_real << std::endl;
                        std::cout << "gauss_s1_y_real: " << gauss_s1_y_real << std::endl;
                    }
*/

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            //float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 
            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            //float gauss_s2 = gauss_s2_precomputed[gauss_s2_index++];
            float gauss_s2;
            switch (gauss_s2_index) {
                case 0:  gauss_s2 = 0.026022f; break;
                case 1:  gauss_s2 = 0.040585f; break;
                case 2:  gauss_s2 = 0.040585f; break;
                case 3:  gauss_s2 = 0.026022f; break;
                case 4:  gauss_s2 = 0.040585f; break;
                case 5:  gauss_s2 = 0.063297f; break;
                case 6:  gauss_s2 = 0.063297f; break;
                case 7:  gauss_s2 = 0.040585f; break;
                case 8:  gauss_s2 = 0.040585f; break;
                case 9:  gauss_s2 = 0.063297f; break;
                case 10: gauss_s2 = 0.063297f; break;
                case 11: gauss_s2 = 0.040585f; break;
                case 12: gauss_s2 = 0.026022f; break;
                case 13: gauss_s2 = 0.040585f; break;
                case 14: gauss_s2 = 0.040585f; break;
                case 15: gauss_s2 = 0.026022f; break;
            };
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}